

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.cpp
# Opt level: O0

WCHAR * __thiscall
PlatformAgnostic::DateTime::Utility::GetStandardName(Utility *this,size_t *nameLength,YMD *ymd)

{
  code *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  int local_30;
  bool local_29;
  int mOffset;
  bool isDST;
  double tv;
  YMD *ymd_local;
  size_t *nameLength_local;
  Utility *this_local;
  
  tv = (double)ymd;
  ymd_local = (YMD *)nameLength;
  nameLength_local = (size_t *)this;
  if (ymd == (YMD *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/DateTime.cpp"
                       ,0x3f,"(ymd != __null)","xplat needs DateTime::YMD is defined for this call")
    ;
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  _mOffset = Js::DateUtilities::TvFromDate
                       ((double)*(int *)tv,(double)*(int *)((long)tv + 8),
                        (double)*(int *)((long)tv + 0xc),(double)*(int *)((long)tv + 0x18));
  iVar4 = GetTZ(_mOffset,(WCHAR *)this,&local_29,&local_30);
  (this->data).standardNameLength = (long)iVar4;
  uVar2 = *(undefined4 *)((long)&(this->data).standardNameLength + 4);
  ymd_local->year = *(undefined4 *)&(this->data).standardNameLength;
  ymd_local->yt = uVar2;
  return (WCHAR *)this;
}

Assistant:

const WCHAR *Utility::GetStandardName(size_t *nameLength, const DateTime::YMD *ymd)
    {
        AssertMsg(ymd != NULL, "xplat needs DateTime::YMD is defined for this call");
        double tv = Js::DateUtilities::TvFromDate(ymd->year, ymd->mon, ymd->mday, ymd->time);
        bool isDST;
        int mOffset;
        data.standardNameLength = GetTZ(tv, data.standardName, &isDST, &mOffset);
        *nameLength = data.standardNameLength;
        return data.standardName;
    }